

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImDrawList *pIVar1;
  ImVec2 p_min;
  ImVec2 IVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImU32 fill_col;
  ImGuiWindow *pIVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  ImVec2 IVar10;
  ImGuiCol local_1c4;
  ImGuiCol local_174;
  byte local_15a;
  float local_158;
  float local_150;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImU32 local_104;
  ImU32 bg_col_1;
  ImVec2 local_f8;
  char local_ef [7];
  char log_suffix [3];
  char log_prefix [4];
  ImU32 bg_col;
  ImGuiNavHighlightFlags nav_highlight_flags;
  ImVec2 local_b8;
  ImVec2 text_pos;
  ImU32 text_col;
  bool local_a0;
  bool local_9f;
  byte local_9e;
  byte local_9d;
  bool toggled;
  uint uStack_9c;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  bool selected;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_leaf;
  bool is_open;
  ImRect interact_bb;
  float text_width;
  float text_offset_x;
  undefined1 local_6c [8];
  ImRect frame_bb;
  float frame_height;
  float text_base_offset_y;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *label_end_local;
  char *label_local;
  ImGuiTreeNodeFlags flags_local;
  ImGuiID id_local;
  
  pIVar6 = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((pIVar6->SkipItems & 1U) == 0) {
    bVar7 = (flags & 2U) != 0;
    if ((bVar7) || ((flags & 0x400U) != 0)) {
      label_size = (GImGui->Style).FramePadding;
    }
    else {
      ImVec2::ImVec2(&label_size,(GImGui->Style).FramePadding.x,0.0);
    }
    window = (ImGuiWindow *)label_end;
    if (label_end == (char *)0x0) {
      window = (ImGuiWindow *)FindRenderedTextEnd(label,(char *)0x0);
    }
    _frame_height = CalcTextSize(label,(char *)window,false,-1.0);
    frame_bb.Max.y = ImMax<float>(label_size.y,(pIVar6->DC).CurrLineTextBaseOffset);
    fVar9 = (pIVar3->Style).FramePadding.y;
    fVar9 = ImMin<float>((pIVar6->DC).CurrLineSize.y,fVar9 + fVar9 + pIVar3->FontSize);
    frame_bb.Max.x = ImMax<float>(fVar9,label_size.y + label_size.y + text_base_offset_y);
    ImVec2::ImVec2((ImVec2 *)&text_width,(pIVar6->WorkRect).Max.x,
                   (pIVar6->DC).CursorPos.y + frame_bb.Max.x);
    ImRect::ImRect((ImRect *)local_6c,&(pIVar6->DC).CursorPos,(ImVec2 *)&text_width);
    if (bVar7) {
      local_6c._0_4_ = (float)local_6c._0_4_ - (float)(int)((pIVar6->WindowPadding).x * 0.5 + -1.0);
      frame_bb.Min.x = (float)(int)((pIVar6->WindowPadding).x * 0.5) + frame_bb.Min.x;
    }
    if (bVar7) {
      local_150 = label_size.x * 3.0;
    }
    else {
      local_150 = label_size.x * 2.0;
    }
    local_150 = pIVar3->FontSize + local_150;
    if (frame_height <= 0.0) {
      local_158 = 0.0;
    }
    else {
      local_158 = label_size.x + label_size.x + frame_height;
    }
    local_158 = pIVar3->FontSize + local_158;
    ImVec2::ImVec2(&interact_bb.Max,local_158,frame_bb.Max.x);
    ItemSize(&interact_bb.Max,frame_bb.Max.y);
    if (bVar7) {
      unique0x10000450 = (float)local_6c._4_4_;
      button_flags = local_6c._0_4_;
      interact_bb.Min.y = frame_bb.Min.y;
      interact_bb.Min.x = frame_bb.Min.x;
    }
    else {
      fVar9 = (pIVar3->Style).ItemSpacing.x;
      ImRect::ImRect((ImRect *)&button_flags,(float)local_6c._0_4_,(float)local_6c._4_4_,
                     fVar9 + fVar9 + (float)local_6c._0_4_ + local_158,frame_bb.Min.y);
    }
    selected = TreeNodeBehaviorIsOpen(id,flags);
    was_selected = (flags & 0x100U) != 0;
    if ((((selected) && ((pIVar3->NavIdIsAlive & 1U) == 0)) && ((flags & 0x2000U) != 0)) &&
       ((flags & 8U) == 0)) {
      (pIVar6->DC).TreeStoreMayJumpToParentOnPop =
           1 << ((byte)(pIVar6->DC).TreeDepth & 0x1f) | (pIVar6->DC).TreeStoreMayJumpToParentOnPop;
    }
    hovered = ItemAdd((ImRect *)&button_flags,id,(ImRect *)0x0);
    (pIVar6->DC).LastItemStatusFlags = (pIVar6->DC).LastItemStatusFlags | 2;
    IVar10.y = (float)local_6c._4_4_;
    IVar10.x = (float)local_6c._0_4_;
    (pIVar6->DC).LastItemDisplayRect.Min = IVar10;
    IVar2.y = frame_bb.Min.y;
    IVar2.x = frame_bb.Min.x;
    (pIVar6->DC).LastItemDisplayRect.Max = IVar2;
    if (hovered) {
      uStack_9c = 0x400;
      if ((flags & 4U) != 0) {
        uStack_9c = 0x440;
      }
      if ((flags & 0x40U) != 0) {
        uVar5 = 0;
        if ((flags & 0x80U) != 0) {
          uVar5 = 2;
        }
        uStack_9c = uVar5 | 0x10 | uStack_9c;
      }
      if ((was_selected & 1U) == 0) {
        uStack_9c = uStack_9c | 0x1000;
      }
      local_9e = (flags & 1U) != 0;
      local_9d = local_9e;
      bVar4 = ButtonBehavior((ImRect *)&button_flags,id,&local_9f,&local_a0,uStack_9c);
      bVar8 = false;
      if ((was_selected & 1U) == 0) {
        if (bVar4) {
          bVar8 = true;
          if ((flags & 0xc0U) != 0) {
            bVar8 = pIVar3->NavActivateId == id;
          }
          if ((flags & 0x80U) != 0) {
            ImVec2::ImVec2((ImVec2 *)&text_pos.y,(float)button_flags + local_150,interact_bb.Min.y);
            bVar4 = IsMouseHoveringRect((ImVec2 *)&button_flags,(ImVec2 *)&text_pos.y,true);
            local_15a = 0;
            if (bVar4) {
              local_15a = pIVar3->NavDisableMouseHover ^ 0xff;
            }
            bVar8 = bVar8 || (local_15a & 1) != 0;
          }
          if ((flags & 0x40U) != 0) {
            bVar8 = bVar8 || ((pIVar3->IO).MouseDoubleClicked[0] & 1U) != 0;
          }
          if (((pIVar3->DragDropActive & 1U) != 0) && ((selected & 1U) != 0)) {
            bVar8 = false;
          }
        }
        if (((pIVar3->NavId == id) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
           ((pIVar3->NavMoveDir == 0 && ((selected & 1U) != 0)))) {
          bVar8 = true;
          NavMoveRequestCancel();
        }
        if ((((pIVar3->NavId == id) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
            (pIVar3->NavMoveDir == 1)) && ((selected & 1U) == 0)) {
          bVar8 = true;
          NavMoveRequestCancel();
        }
        if (bVar8) {
          selected = (bool)((selected ^ 0xffU) & 1);
          ImGuiStorage::SetInt((pIVar6->DC).StateStorage,id,(uint)selected);
        }
      }
      if ((flags & 4U) != 0) {
        SetItemAllowOverlap();
      }
      if ((local_9d & 1) != (local_9e & 1)) {
        (pIVar6->DC).LastItemStatusFlags = (pIVar6->DC).LastItemStatusFlags | 8;
      }
      text_pos.x = (float)GetColorU32(0,1.0);
      ImVec2::ImVec2((ImVec2 *)&bg_col,local_150,frame_bb.Max.y);
      local_b8 = ::operator+((ImVec2 *)local_6c,(ImVec2 *)&bg_col);
      if (bVar7) {
        if (((local_a0 & 1U) == 0) || ((local_9f & 1U) == 0)) {
          local_174 = 0x18;
          if ((local_9f & 1U) != 0) {
            local_174 = 0x19;
          }
        }
        else {
          local_174 = 0x1a;
        }
        fill_col = GetColorU32(local_174,1.0);
        p_min.y = (float)local_6c._4_4_;
        p_min.x = (float)local_6c._0_4_;
        p_max.y = frame_bb.Min.y;
        p_max.x = frame_bb.Min.x;
        RenderFrame(p_min,p_max,fill_col,true,(pIVar3->Style).FrameRounding);
        RenderNavHighlight((ImRect *)local_6c,id,2);
        pIVar1 = pIVar6->DrawList;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff18,label_size.x,frame_bb.Max.y);
        IVar10 = ::operator+((ImVec2 *)local_6c,(ImVec2 *)&stack0xffffffffffffff18);
        RenderArrow(pIVar1,IVar10,(ImU32)text_pos.x,(selected & 1) * 2 + 1,1.0);
        if ((flags & 0x100000U) != 0) {
          frame_bb.Min.x = frame_bb.Min.x - (pIVar3->FontSize + (pIVar3->Style).FramePadding.x);
        }
        if ((pIVar3->LogEnabled & 1U) == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff00,0.0,0.0);
          RenderTextClipped(&local_b8,&frame_bb.Min,label,(char *)window,(ImVec2 *)&frame_height,
                            (ImVec2 *)&stack0xffffffffffffff00,(ImRect *)0x0);
        }
        else {
          local_ef[3] = '\n';
          local_ef[4] = '#';
          local_ef[5] = '#';
          local_ef[6] = '\0';
          local_ef[0] = '#';
          local_ef[1] = '#';
          local_ef[2] = 0;
          LogRenderedText(&local_b8,local_ef + 3,local_ef + 6);
          ImVec2::ImVec2(&local_f8,0.0,0.0);
          RenderTextClipped(&local_b8,&frame_bb.Min,label,(char *)window,(ImVec2 *)&frame_height,
                            &local_f8,(ImRect *)0x0);
          LogRenderedText(&local_b8,local_ef,local_ef + 2);
        }
      }
      else {
        if (((local_9f & 1U) != 0) || ((local_9d & 1) != 0)) {
          if (((local_a0 & 1U) == 0) || ((local_9f & 1U) == 0)) {
            local_1c4 = 0x18;
            if ((local_9f & 1U) != 0) {
              local_1c4 = 0x19;
            }
          }
          else {
            local_1c4 = 0x1a;
          }
          local_104 = GetColorU32(local_1c4,1.0);
          local_110.y = (float)local_6c._4_4_;
          local_110.x = (float)local_6c._0_4_;
          local_118.y = frame_bb.Min.y;
          local_118.x = frame_bb.Min.x;
          RenderFrame(local_110,local_118,local_104,false,0.0);
          RenderNavHighlight((ImRect *)local_6c,id,2);
        }
        if ((flags & 0x200U) == 0) {
          if ((was_selected & 1U) == 0) {
            pIVar1 = pIVar6->DrawList;
            ImVec2::ImVec2(&local_138,label_size.x,pIVar3->FontSize * 0.15 + frame_bb.Max.y);
            local_130 = ::operator+((ImVec2 *)local_6c,&local_138);
            RenderArrow(pIVar1,local_130,(ImU32)text_pos.x,(selected & 1) * 2 + 1,0.7);
          }
        }
        else {
          pIVar1 = pIVar6->DrawList;
          ImVec2::ImVec2(&local_128,local_150 * 0.5,pIVar3->FontSize * 0.5 + frame_bb.Max.y);
          local_120 = ::operator+((ImVec2 *)local_6c,&local_128);
          RenderBullet(pIVar1,local_120,(ImU32)text_pos.x);
        }
        if ((pIVar3->LogEnabled & 1U) != 0) {
          LogRenderedText(&local_b8,">",(char *)0x0);
        }
        RenderText(local_b8,label,(char *)window,false);
      }
      if (((selected & 1U) != 0) && ((flags & 8U) == 0)) {
        TreePushOverrideID(id);
      }
      flags_local._3_1_ = (bool)(selected & 1);
    }
    else {
      if (((selected & 1U) != 0) && ((flags & 8U) == 0)) {
        TreePushOverrideID(id);
      }
      flags_local._3_1_ = (bool)(selected & 1);
    }
  }
  else {
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(padding.y, window->DC.CurrLineTextBaseOffset); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect frame_bb = ImRect(window->DC.CursorPos, ImVec2(window->WorkRect.Max.x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        frame_bb.Min.x -= (float)(int)(window->WindowPadding.x * 0.5f - 1.0f);
        frame_bb.Max.x += (float)(int)(window->WindowPadding.x * 0.5f);
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify if we want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? frame_bb : ImRect(frame_bb.Min.x, frame_bb.Min.y, frame_bb.Min.x + text_width + style.ItemSpacing.x*2, frame_bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeStoreMayJumpToParentOnPop |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    window->DC.LastItemDisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushOverrideID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0 (default) .................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers;
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        button_flags |= ImGuiButtonFlags_AllowItemOverlap;
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;

    bool selected = (flags & ImGuiTreeNodeFlags_Selected) != 0;
    const bool was_selected = selected;

    bool hovered, held;
    bool pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    bool toggled = false;
    if (!is_leaf)
    {
        if (pressed)
        {
            toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) || (g.NavActivateId == id);
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y)) && (!g.NavDisableMouseHover);
            if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
                toggled |= g.IO.MouseDoubleClicked[0];
            if (g.DragDropActive && is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = false;
        }

        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, TreeNodeBehavior() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    const ImVec2 text_pos = frame_bb.Min + ImVec2(text_offset_x, text_base_offset_y);
    ImGuiNavHighlightFlags nav_highlight_flags = ImGuiNavHighlightFlags_TypeThin;
    if (display_frame)
    {
        // Framed type
        const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        RenderArrow(window->DrawList, frame_bb.Min + ImVec2(padding.x, text_base_offset_y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        if (flags & ImGuiTreeNodeFlags_ClipLabelForTrailingButton)
            frame_bb.Max.x -= g.FontSize + style.FramePadding.x;
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(&text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
            LogRenderedText(&text_pos, log_suffix, log_suffix+2);
        }
        else
        {
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || selected)
        {
            const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
            RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, false);
            RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        }

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, frame_bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, frame_bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogRenderedText(&text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushOverrideID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}